

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall HighsSymmetries::mergeOrbits(HighsSymmetries *this,HighsInt v1,HighsInt v2)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  
  if (v1 != v2) {
    HVar5 = getOrbit(this,v1);
    HVar6 = getOrbit(this,v2);
    if (HVar5 != HVar6) {
      lVar7 = (long)HVar6;
      piVar3 = (this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar3[lVar7];
      lVar9 = (long)HVar5;
      iVar1 = piVar3[lVar9];
      lVar8 = lVar7;
      lVar4 = lVar9;
      if (iVar2 < iVar1) {
        lVar8 = lVar9;
        lVar4 = lVar7;
        HVar6 = HVar5;
      }
      (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = HVar6;
      piVar10 = piVar3 + lVar9;
      if (iVar2 < iVar1) {
        piVar10 = piVar3 + lVar7;
      }
      piVar3[lVar8] = piVar3[lVar8] + *piVar10;
    }
  }
  return;
}

Assistant:

void HighsSymmetries::mergeOrbits(HighsInt v1, HighsInt v2) {
  if (v1 == v2) return;

  HighsInt orbit1 = getOrbit(v1);
  HighsInt orbit2 = getOrbit(v2);

  if (orbit1 == orbit2) return;

  if (orbitSize[orbit2] < orbitSize[orbit1]) {
    orbitPartition[orbit2] = orbit1;
    orbitSize[orbit1] += orbitSize[orbit2];
  } else {
    orbitPartition[orbit1] = orbit2;
    orbitSize[orbit2] += orbitSize[orbit1];
  }

  return;
}